

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O1

void Debug::posixSignalHandler(int signum,siginfo_t *si,void *ucontext)

{
  _Any_data *p_Var1;
  long lVar2;
  
  p_Var1 = (_Any_data *)PosixCrashHandler::getInstance();
  if (*(long *)(p_Var1 + 1) != 0) {
    (**(code **)((long)p_Var1 + 0x18))(p_Var1);
  }
  lVar2 = 3;
  _Exit(3);
  if (*(long *)(lVar2 + 0x10) != 0) {
    (**(code **)(lVar2 + 0x18))();
    return;
  }
  return;
}

Assistant:

void posixSignalHandler( int signum, siginfo_t* si, void* ucontext ) {
        (void)si;
        (void)ucontext;

        auto &handler = PosixCrashHandler::getInstance();
        handler.handleCrash();

        // If you caught one of the above signals, it is likely you just
        // want to quit your program right now.
        //exit( signum );
        std::_Exit(CHILLOUT_EXIT_CODE);
    }